

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

ModuleImpl * __thiscall
capnp::SchemaParser::getModuleImpl(SchemaParser *this,Own<capnp::SchemaFile> *file)

{
  unordered_map<capnp::SchemaFile_const*,kj::Own<capnp::SchemaParser::ModuleImpl>,capnp::(anonymous_namespace)::SchemaFileHash,capnp::(anonymous_namespace)::SchemaFileEq,std::allocator<std::pair<capnp::SchemaFile_const*const,kj::Own<capnp::SchemaParser::ModuleImpl>>>>
  *this_00;
  Own<capnp::SchemaFile> *params_1;
  pointer ppVar1;
  RefOrVoid<capnp::SchemaParser::ModuleImpl> pMVar2;
  __enable_if_t<is_constructible<value_type,_pair<SchemaFile_*,_Own<ModuleImpl>_>_&&>::value,_pair<iterator,_bool>_>
  _Var3;
  Own<capnp::SchemaParser::ModuleImpl> local_98;
  _Node_iterator_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
  local_88;
  undefined1 local_80;
  Own<capnp::SchemaParser::ModuleImpl> local_78;
  SchemaFile *local_68;
  pair<capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>_> local_60;
  _Node_iterator_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
  local_38;
  __enable_if_t<is_constructible<value_type,_pair<SchemaFile_*,_Own<ModuleImpl>_>_&&>::value,_pair<iterator,_bool>_>
  insertResult;
  Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
  lock;
  Own<capnp::SchemaFile> *file_local;
  SchemaParser *this_local;
  
  kj::Own<capnp::SchemaParser::Impl>::operator->(&this->impl);
  kj::
  MutexGuarded<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
  ::lockExclusive((MutexGuarded<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
                   *)&insertResult.second);
  this_00 = (unordered_map<capnp::SchemaFile_const*,kj::Own<capnp::SchemaParser::ModuleImpl>,capnp::(anonymous_namespace)::SchemaFileHash,capnp::(anonymous_namespace)::SchemaFileEq,std::allocator<std::pair<capnp::SchemaFile_const*const,kj::Own<capnp::SchemaParser::ModuleImpl>>>>
             *)kj::
               Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
               ::operator->((Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
                             *)&insertResult.second);
  local_68 = kj::Own<capnp::SchemaFile>::get(file);
  kj::Own<capnp::SchemaParser::ModuleImpl>::Own(&local_78);
  std::make_pair<capnp::SchemaFile*,kj::Own<capnp::SchemaParser::ModuleImpl>>
            (&local_60,&local_68,&local_78);
  _Var3 = std::
          unordered_map<capnp::SchemaFile_const*,kj::Own<capnp::SchemaParser::ModuleImpl>,capnp::(anonymous_namespace)::SchemaFileHash,capnp::(anonymous_namespace)::SchemaFileEq,std::allocator<std::pair<capnp::SchemaFile_const*const,kj::Own<capnp::SchemaParser::ModuleImpl>>>>
          ::insert<std::pair<capnp::SchemaFile*,kj::Own<capnp::SchemaParser::ModuleImpl>>>
                    (this_00,&local_60);
  local_88._M_cur =
       (__node_type *)
       _Var3.first.
       super__Node_iterator_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
       ._M_cur;
  local_80 = _Var3.second;
  local_38._M_cur = local_88._M_cur;
  insertResult.first.
  super__Node_iterator_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
  ._M_cur._0_1_ = local_80;
  std::pair<capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>_>::~pair(&local_60);
  kj::Own<capnp::SchemaParser::ModuleImpl>::~Own(&local_78);
  if (((byte)insertResult.first.
             super__Node_iterator_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
             ._M_cur & 1) != 0) {
    params_1 = kj::mv<kj::Own<capnp::SchemaFile>>(file);
    kj::heap<capnp::SchemaParser::ModuleImpl,capnp::SchemaParser_const&,kj::Own<capnp::SchemaFile>>
              ((kj *)&local_98,this,params_1);
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_false,_true>
                           *)&local_38);
    kj::Own<capnp::SchemaParser::ModuleImpl>::operator=(&ppVar1->second,&local_98);
    kj::Own<capnp::SchemaParser::ModuleImpl>::~Own(&local_98);
  }
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_false,_true>
                         *)&local_38);
  pMVar2 = kj::Own<capnp::SchemaParser::ModuleImpl>::operator*(&ppVar1->second);
  kj::
  Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
  ::~Locked((Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
             *)&insertResult.second);
  return pMVar2;
}

Assistant:

SchemaParser::ModuleImpl& SchemaParser::getModuleImpl(kj::Own<SchemaFile>&& file) const {
  auto lock = impl->fileMap.lockExclusive();

  auto insertResult = lock->insert(std::make_pair(file.get(), kj::Own<ModuleImpl>()));
  if (insertResult.second) {
    // This is a newly-inserted entry.  Construct the ModuleImpl.
    insertResult.first->second = kj::heap<ModuleImpl>(*this, kj::mv(file));
  }
  return *insertResult.first->second;
}